

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_handler.cpp
# Opt level: O2

void __thiscall ProtoHandler::OnAddBreakPointReq(ProtoHandler *this,AddBreakpointParams *params)

{
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  EmmyDebuggerManager *this_00;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2> _Stack_38;
  
  this_00 = EmmyFacade::GetDebugManager(this->_owner);
  if (params->clear == true) {
    EmmyDebuggerManager::RemoveAllBreakpoints(this_00);
  }
  p_Var1 = &((params->breakPoints).
             super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var2 = &((params->breakPoints).
                  super__Vector_base<std::shared_ptr<BreakPoint>,_std::allocator<std::shared_ptr<BreakPoint>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>; p_Var2 != p_Var1;
      p_Var2 = p_Var2 + 1) {
    std::__shared_ptr<BreakPoint,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&_Stack_38,p_Var2);
    EmmyDebuggerManager::AddBreakpoint(this_00,(shared_ptr<BreakPoint> *)&_Stack_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  }
  return;
}

Assistant:

void ProtoHandler::OnAddBreakPointReq(AddBreakpointParams &params) {
	auto &manager = _owner->GetDebugManager();
	if (params.clear) {
		manager.RemoveAllBreakpoints();
	}

	for (auto &bp: params.breakPoints) {
		manager.AddBreakpoint(bp);
	}
}